

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O0

uint32_t __thiscall
basist::bitwise_decoder::decode_huffman
          (bitwise_decoder *this,huffman_decoding_table *ct,int fast_lookup_bits)

{
  ulong uVar1;
  ulong uVar2;
  byte *pbVar3;
  uint32_t uVar4;
  uint *puVar5;
  short *psVar6;
  int in_EDX;
  vector<unsigned_char> *in_RSI;
  vector<int> *in_RDI;
  int sym;
  int code_len;
  uint32_t c;
  uint32_t huffman_fast_lookup_size;
  size_t in_stack_ffffffffffffffc8;
  uint local_24;
  int local_20;
  uint local_1c;
  
  uVar4 = basisu::vector<unsigned_char>::size(in_RSI);
  if (uVar4 == 0) {
    __assert_fail("ct.m_code_sizes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                  ,0x1bf,
                  "uint32_t basist::bitwise_decoder::decode_huffman(const huffman_decoding_table &, int)"
                 );
  }
  do {
    if (0xf < *(uint *)((long)&in_RDI[2].m_p + 4)) {
      puVar5 = (uint *)basisu::vector<int>::operator[](in_RDI,in_stack_ffffffffffffffc8);
      local_24 = *puVar5;
      local_20 = in_EDX;
      if ((int)local_24 < 0) {
        do {
          local_20 = local_20 + 1;
          psVar6 = basisu::vector<short>::operator[]
                             ((vector<short> *)in_RDI,in_stack_ffffffffffffffc8);
          local_24 = (uint)*psVar6;
        } while ((int)local_24 < 0);
      }
      else {
        local_20 = (int)local_24 >> 0x10;
        local_24 = local_24 & 0xffff;
      }
      *(uint *)&in_RDI[2].m_p = *(uint *)&in_RDI[2].m_p >> ((byte)local_20 & 0x1f);
      *(int *)((long)&in_RDI[2].m_p + 4) = *(int *)((long)&in_RDI[2].m_p + 4) - local_20;
      return local_24;
    }
    local_1c = 0;
    uVar1._0_4_ = in_RDI->m_size;
    uVar1._4_4_ = in_RDI->m_capacity;
    uVar2._0_4_ = in_RDI[1].m_size;
    uVar2._4_4_ = in_RDI[1].m_capacity;
    if (uVar1 < uVar2) {
      pbVar3 = *(byte **)&in_RDI->m_size;
      *(byte **)&in_RDI->m_size = pbVar3 + 1;
      local_1c = (uint)*pbVar3;
    }
    *(uint *)&in_RDI[2].m_p =
         local_1c << ((byte)*(undefined4 *)((long)&in_RDI[2].m_p + 4) & 0x1f) |
         *(uint *)&in_RDI[2].m_p;
    *(int *)((long)&in_RDI[2].m_p + 4) = *(int *)((long)&in_RDI[2].m_p + 4) + 8;
  } while (*(uint *)((long)&in_RDI[2].m_p + 4) < 0x21);
  __assert_fail("m_bit_buf_size <= 32",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                ,0x1cb,
                "uint32_t basist::bitwise_decoder::decode_huffman(const huffman_decoding_table &, int)"
               );
}

Assistant:

inline uint32_t decode_huffman(const huffman_decoding_table &ct, int fast_lookup_bits = basisu::cHuffmanFastLookupBits)
		{
			assert(ct.m_code_sizes.size());

			const uint32_t huffman_fast_lookup_size = 1 << fast_lookup_bits;
						
			while (m_bit_buf_size < 16)
			{
				uint32_t c = 0;
				if (m_pBuf < m_pBuf_end)
					c = *m_pBuf++;

				m_bit_buf |= (c << m_bit_buf_size);
				m_bit_buf_size += 8;
				assert(m_bit_buf_size <= 32);
			}
						
			int code_len;

			int sym;
			if ((sym = ct.m_lookup[m_bit_buf & (huffman_fast_lookup_size - 1)]) >= 0)
			{
				code_len = sym >> 16;
				sym &= 0xFFFF;
			}
			else
			{
				code_len = fast_lookup_bits;
				do
				{
					sym = ct.m_tree[~sym + ((m_bit_buf >> code_len++) & 1)]; // ~sym = -sym - 1
				} while (sym < 0);
			}

			m_bit_buf >>= code_len;
			m_bit_buf_size -= code_len;

			return sym;
		}